

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O2

Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
renderdesc::Loader::loadFramebuffers_abi_cxx11_
          (Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Loader *this)

{
  anon_struct_96_4_06235674_for_names_ *this_00;
  anon_struct_48_2_fed59856_for_indexes_ *this_01;
  _Rb_tree_node_base *__rhs;
  _Alloc_hider _Var1;
  reference_wrapper<const_yaml::Mapping> rVar2;
  reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_> rVar3;
  undefined1 *puVar4;
  Mapping *pMVar5;
  Mapping *this_02;
  vector<yaml::Value,_std::allocator<yaml::Value>_> *pvVar6;
  Value *this_03;
  pointer pVVar7;
  Pipeline *pPVar8;
  undefined8 uVar9;
  pointer pFVar10;
  pointer pFVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  reference_wrapper<const_yaml::Mapping> *prVar15;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var16;
  reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_> *prVar17;
  long *plVar18;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *prVar19;
  PixelType *pPVar20;
  ulong uVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  _Base_ptr p_Var23;
  ulong uVar24;
  int index;
  _Base_ptr p_Var25;
  Texture *this_04;
  Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__return_storage_ptr___00;
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_05;
  pointer this_06;
  int iVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  Texture texture;
  Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tex_type_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  Framebuffer fb;
  ExpectedRef<const_Mapping,_std::string> tex_result;
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  width_result;
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  height_result;
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pingpong_result;
  ExpectedRef<const_Sequence,_std::string> textures_result;
  ExpectedRef<const_Mapping,_std::string> yfb_result;
  ExpectedRef<const_Sequence,_std::string> size_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ExpectedRef<const_Mapping,_std::string> map_fb_result;
  undefined1 local_c0 [48];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  pMVar5 = this->root_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&texture,"framebuffers",(allocator<char> *)&yfb_result);
  yaml::Mapping::getMapping(&map_fb_result,pMVar5,(string *)&texture);
  std::__cxx11::string::~string((string *)&texture);
  if (map_fb_result.has_value_ == false) {
    pbVar22 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::error(&map_fb_result);
    std::__cxx11::string::string((string *)&texture,(string *)pbVar22);
    this_04 = &texture;
    Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)this_04);
LAB_00121056:
    std::__cxx11::string::~string((string *)this_04);
  }
  else {
    prVar15 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value(&map_fb_result);
    pMVar5 = prVar15->_M_data;
    this_00 = &this->names_;
    this_01 = &this->indexes_;
    for (p_Var23 = (pMVar5->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var23 != &(pMVar5->map_)._M_t._M_impl.super__Rb_tree_header;
        p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23)) {
      __rhs = p_Var23 + 1;
      _Var16 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((this->names_).framebuffer.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->names_).framebuffer.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      if (_Var16._M_current !=
          (this->names_).framebuffer.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        format_abi_cxx11_((string *)&yfb_result,"Framebuffer \'%s\' is not unique",
                          *(undefined8 *)__rhs);
        texture._0_8_ = &texture.file;
        rVar2._M_data = (Mapping *)((long)&yfb_result.field_0 + 0x10);
        if (yfb_result.field_0.value_._M_data ==
            (reference_wrapper<const_yaml::Mapping>)rVar2._M_data) {
          texture.file._M_string_length = yfb_result.field_0._24_8_;
        }
        else {
          texture._0_8_ = yfb_result.field_0.value_._M_data;
        }
        texture.file._M_dataplus._M_p._1_7_ = yfb_result.field_0._17_7_;
        texture.file._M_dataplus._M_p._0_1_ = yfb_result.field_0._16_1_;
        this_04 = (Texture *)&yfb_result;
        texture._8_8_ = yfb_result.field_0.error_.error_._M_string_length;
        yfb_result.field_0.error_.error_._M_string_length = 0;
        yfb_result.field_0._16_1_ = 0;
        yfb_result.field_0._0_8_ = rVar2._M_data;
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(UnexpectedType *)&texture);
        std::__cxx11::string::~string((string *)&texture);
        goto LAB_00121056;
      }
      yaml::Value::getMapping_abi_cxx11_(&yfb_result,(Value *)(p_Var23 + 2));
      if (yfb_result.has_value_ == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &width_result,"Framebuffer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &size_result,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &width_result," desc object is not a mapping");
        texture._0_8_ = &texture.file;
        rVar3._M_data =
             (vector<yaml::Value,_std::allocator<yaml::Value>_> *)
             ((long)&size_result.field_0 + 0x10);
        if (size_result.field_0.value_._M_data ==
            (reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>)
            rVar3._M_data) {
          texture.file._M_string_length = size_result.field_0._24_8_;
        }
        else {
          texture._0_8_ = size_result.field_0.value_._M_data;
        }
        texture.file._M_dataplus._M_p._1_7_ = size_result.field_0._17_7_;
        texture.file._M_dataplus._M_p._0_1_ = size_result.field_0._16_1_;
        texture._8_8_ = size_result.field_0.error_.error_._M_string_length;
        size_result.field_0.error_.error_._M_string_length = 0;
        size_result.field_0._16_1_ = 0;
        size_result.field_0._0_8_ = rVar3._M_data;
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(UnexpectedType *)&texture);
        std::__cxx11::string::~string((string *)&texture);
        std::__cxx11::string::~string((string *)&size_result);
        std::__cxx11::string::~string((string *)&width_result);
LAB_00121578:
        Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected(&yfb_result);
        goto LAB_00121585;
      }
      prVar15 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::value(&yfb_result);
      if ((long)(this->names_).framebuffer.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->names_).framebuffer.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5 !=
          ((long)(this->pipeline_->framebuffers).
                 super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->pipeline_->framebuffers).
                super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x14) {
        __assert_fail("framebuffer_index == pipeline_.framebuffers.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/RenderDesc.cpp"
                      ,0x99,"Expected<void, std::string> renderdesc::Loader::loadFramebuffers()");
      }
      this_02 = prVar15->_M_data;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texture,"size",(allocator<char> *)&width_result);
      yaml::Mapping::getSequence(&size_result,this_02,(string *)&texture);
      std::__cxx11::string::~string((string *)&texture);
      if (size_result.has_value_ == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pingpong_result,"Cannot read size for framebuffer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &height_result,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pingpong_result,": ");
        pbVar22 = Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error(&size_result);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &width_result,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &height_result,pbVar22);
        texture._0_8_ = &texture.file;
        puVar4 = (undefined1 *)((long)&width_result.field_0 + 0x10);
        if ((undefined1 *)width_result.field_0.value_ == puVar4) {
          texture.file._M_string_length = width_result.field_0._24_8_;
        }
        else {
          texture.w = width_result.field_0._0_4_;
          texture.h = width_result.field_0._4_4_;
        }
        texture.file._M_dataplus._M_p._1_7_ = width_result.field_0._17_7_;
        texture.file._M_dataplus._M_p._0_1_ = width_result.field_0._16_1_;
        texture._8_8_ = width_result.field_0.error_.error_._M_string_length;
        width_result.field_0.error_.error_._M_string_length = 0;
        width_result.field_0._16_1_ = 0;
        width_result.field_0.value_ = (long)puVar4;
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(UnexpectedType *)&texture);
        std::__cxx11::string::~string((string *)&texture);
        std::__cxx11::string::~string((string *)&width_result);
        std::__cxx11::string::~string((string *)&height_result);
        this_05 = &pingpong_result;
LAB_00121489:
        std::__cxx11::string::~string((string *)this_05);
LAB_0012156b:
        Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected(&size_result);
        goto LAB_00121578;
      }
      prVar17 = Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::value(&size_result);
      pvVar6 = prVar17->_M_data;
      this_03 = (pvVar6->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((long)(pvVar6->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)this_03 != 0xe0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &height_result,"Framebuffer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &width_result,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &height_result," size must have 2 elements");
        texture._0_8_ = &texture.file;
        puVar4 = (undefined1 *)((long)&width_result.field_0 + 0x10);
        if ((undefined1 *)width_result.field_0.value_ == puVar4) {
          texture.file._M_string_length = width_result.field_0._24_8_;
        }
        else {
          texture.w = width_result.field_0._0_4_;
          texture.h = width_result.field_0._4_4_;
        }
        texture.file._M_dataplus._M_p._1_7_ = width_result.field_0._17_7_;
        texture.file._M_dataplus._M_p._0_1_ = width_result.field_0._16_1_;
        texture._8_8_ = width_result.field_0.error_.error_._M_string_length;
        width_result.field_0.error_.error_._M_string_length = 0;
        width_result.field_0._16_1_ = 0;
        width_result.field_0.value_ = (long)puVar4;
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(UnexpectedType *)&texture);
        std::__cxx11::string::~string((string *)&texture);
        std::__cxx11::string::~string((string *)&width_result);
        this_05 = &height_result;
        goto LAB_00121489;
      }
      yaml::Value::getInt_abi_cxx11_(&width_result,this_03);
      if (width_result.has_value_ == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &textures_result,"Cannot read width for framebuffer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pingpong_result,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &textures_result,": ");
        pbVar22 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error(&width_result);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &height_result,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pingpong_result,pbVar22);
        texture._0_8_ = &texture.file;
        puVar4 = (undefined1 *)((long)&height_result.field_0 + 0x10);
        if ((undefined1 *)height_result.field_0.value_ == puVar4) {
          texture.file._M_string_length = height_result.field_0._24_8_;
        }
        else {
          texture.w = height_result.field_0._0_4_;
          texture.h = height_result.field_0._4_4_;
        }
        texture.file._M_dataplus._M_p._1_7_ = height_result.field_0._17_7_;
        texture.file._M_dataplus._M_p._0_1_ = height_result.field_0._16_1_;
        texture._8_8_ = height_result.field_0.error_.error_._M_string_length;
        height_result.field_0.error_.error_._M_string_length = 0;
        height_result.field_0._16_1_ = 0;
        height_result.field_0.value_ = (long)puVar4;
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(UnexpectedType *)&texture);
        std::__cxx11::string::~string((string *)&texture);
        std::__cxx11::string::~string((string *)&height_result);
        std::__cxx11::string::~string((string *)&pingpong_result);
        std::__cxx11::string::~string((string *)&textures_result);
LAB_0012155e:
        Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected(&width_result);
        goto LAB_0012156b;
      }
      plVar18 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::value(&width_result);
      lVar12 = *plVar18;
      yaml::Value::getInt_abi_cxx11_
                (&height_result,
                 (pvVar6->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>)._M_impl.
                 super__Vector_impl_data._M_start + 1);
      if (height_result.has_value_ == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tex_result,"Cannot read height for framebuffer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &textures_result,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tex_result,": ");
        pbVar22 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error(&height_result);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pingpong_result,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &textures_result,pbVar22);
        texture._0_8_ = &texture.file;
        puVar4 = (undefined1 *)((long)&pingpong_result.field_0 + 0x10);
        if ((undefined1 *)pingpong_result.field_0.value_ == puVar4) {
          texture.file._M_string_length = pingpong_result.field_0._24_8_;
        }
        else {
          texture.w = pingpong_result.field_0._0_4_;
          texture.h = pingpong_result.field_0._4_4_;
        }
        texture.file._M_dataplus._M_p._1_7_ = pingpong_result.field_0._17_7_;
        texture.file._M_dataplus._M_p._0_1_ = pingpong_result.field_0._16_1_;
        texture._8_8_ = pingpong_result.field_0.error_.error_._M_string_length;
        pingpong_result.field_0.error_.error_._M_string_length = 0;
        pingpong_result.field_0._16_1_ = 0;
        pingpong_result.field_0.value_ = (long)puVar4;
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(UnexpectedType *)&texture);
        std::__cxx11::string::~string((string *)&texture);
        std::__cxx11::string::~string((string *)&pingpong_result);
        std::__cxx11::string::~string((string *)&textures_result);
        std::__cxx11::string::~string((string *)&tex_result);
        Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected(&height_result);
        goto LAB_0012155e;
      }
      plVar18 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::value(&height_result);
      lVar13 = *plVar18;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texture,"pingpong",(allocator<char> *)&textures_result);
      yaml::Mapping::getInt(&pingpong_result,this_02,(string *)&texture);
      std::__cxx11::string::~string((string *)&texture);
      if (pingpong_result.has_value_ == true) {
        plVar18 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&pingpong_result);
        bVar28 = *plVar18 != 0;
      }
      else {
        bVar28 = false;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texture,"textures",(allocator<char> *)&tex_result);
      yaml::Mapping::getSequence(&textures_result,this_02,(string *)&texture);
      std::__cxx11::string::~string((string *)&texture);
      if (textures_result.has_value_ == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       "Cannot read target textures for framebuffer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tex_type_result,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       ": ");
        pbVar22 = Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error(&textures_result);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tex_result,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tex_type_result,pbVar22);
        rVar2._M_data = (Mapping *)((long)&tex_result.field_0 + 0x10);
        if (tex_result.field_0.value_._M_data ==
            (reference_wrapper<const_yaml::Mapping>)rVar2._M_data) {
          texture.file._M_string_length = tex_result.field_0._24_8_;
          texture._0_8_ = &texture.file;
        }
        else {
          texture._0_8_ = tex_result.field_0.value_._M_data;
        }
        texture.file._M_dataplus._M_p._1_7_ = tex_result.field_0._17_7_;
        texture.file._M_dataplus._M_p._0_1_ = tex_result.field_0._16_1_;
        texture._8_8_ = tex_result.field_0.error_.error_._M_string_length;
        tex_result.field_0.error_.error_._M_string_length = 0;
        tex_result.field_0._16_1_ = 0;
        tex_result.field_0._0_8_ = rVar2._M_data;
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(UnexpectedType *)&texture);
        std::__cxx11::string::~string((string *)&texture);
        std::__cxx11::string::~string((string *)&tex_result);
        std::__cxx11::string::~string((string *)&tex_type_result);
        std::__cxx11::string::~string((string *)&result);
        bVar29 = false;
      }
      else {
        prVar17 = Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&textures_result);
        fb.textures_count = 0;
        this_06 = (prVar17->_M_data->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pVVar7 = (prVar17->_M_data->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        while( true ) {
          __return_storage_ptr___00 =
               (Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&result;
          bVar29 = this_06 == pVVar7;
          if (bVar29) break;
          yaml::Value::getMapping_abi_cxx11_(&tex_result,this_06);
          if (tex_result.has_value_ == false) {
            format_abi_cxx11_((string *)&tex_type_result,
                              "%dth texture of framebuffer %s is not a mapping",
                              (ulong)(uint)fb.textures_count,*(undefined8 *)__rhs);
LAB_00120cd5:
            texture._0_8_ = &texture.file;
            _Var1._M_p = (pointer)((long)&tex_type_result.field_0 + 0x10);
            if (tex_type_result.field_0.error_.error_._M_dataplus._M_p == (_Alloc_hider)_Var1._M_p)
            {
              texture.file._M_string_length = tex_type_result.field_0._24_8_;
            }
            else {
              texture._0_8_ = tex_type_result.field_0.error_.error_._M_dataplus._M_p;
            }
            texture.file._M_dataplus._M_p._1_7_ = tex_type_result.field_0._17_7_;
            texture.file._M_dataplus._M_p._0_1_ = tex_type_result.field_0._16_1_;
            texture._8_8_ = tex_type_result.field_0.error_.error_._M_string_length;
            tex_type_result.field_0.error_.error_._M_string_length = 0;
            tex_type_result.field_0._16_1_ = 0;
            tex_type_result.field_0.error_.error_._M_dataplus._M_p = (_Alloc_hider)_Var1._M_p;
            Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,(UnexpectedType *)&texture);
            std::__cxx11::string::~string((string *)&texture);
            __return_storage_ptr___00 = &tex_type_result;
LAB_00120f3e:
            std::__cxx11::string::~string((string *)__return_storage_ptr___00);
            Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected(&tex_result);
            goto LAB_00120fbe;
          }
          prVar15 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value(&tex_result);
          if ((prVar15->_M_data->map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 1) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __return_storage_ptr___00,"Framebuffer ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tex_type_result,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __return_storage_ptr___00,
                           " target texture should have only one key:value pair: name and format");
            texture._0_8_ = &texture.file;
            _Var1._M_p = (pointer)((long)&tex_type_result.field_0 + 0x10);
            if (tex_type_result.field_0.error_.error_._M_dataplus._M_p == (_Alloc_hider)_Var1._M_p)
            {
              texture.file._M_string_length = tex_type_result.field_0._24_8_;
            }
            else {
              texture._0_8_ = tex_type_result.field_0.error_.error_._M_dataplus._M_p;
            }
            texture.file._M_dataplus._M_p._1_7_ = tex_type_result.field_0._17_7_;
            texture.file._M_dataplus._M_p._0_1_ = tex_type_result.field_0._16_1_;
            texture._8_8_ = tex_type_result.field_0.error_.error_._M_string_length;
            tex_type_result.field_0.error_.error_._M_string_length = 0;
            tex_type_result.field_0._16_1_ = 0;
            tex_type_result.field_0.error_.error_._M_dataplus._M_p = (_Alloc_hider)_Var1._M_p;
            Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,(UnexpectedType *)&texture);
            std::__cxx11::string::~string((string *)&texture);
            std::__cxx11::string::~string((string *)&tex_type_result);
            goto LAB_00120f3e;
          }
          if (3 < fb.textures_count) {
            format_abi_cxx11_((string *)&tex_type_result,
                              "Too many targets for framebuffer %s, max: %d",*(undefined8 *)__rhs,4)
            ;
            goto LAB_00120cd5;
          }
          p_Var25 = (prVar15->_M_data->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          yaml::Value::getString_abi_cxx11_
                    ((ExpectedRef<const_std::string,_std::string> *)&texture,(Value *)(p_Var25 + 2))
          ;
          if (texture.file.field_2._M_local_buf[0] == '\0') {
            pbVar22 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::error((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&texture);
            std::operator+(&local_2b0,"Cannot read PixelType: ",pbVar22);
LAB_00120734:
            result.field_0.error_.error_._M_dataplus._M_p =
                 (_Alloc_hider)((long)&result.field_0 + 0x10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p == &local_2b0.field_2) {
              result.field_0._24_8_ = local_2b0.field_2._8_8_;
            }
            else {
              result.field_0.error_.error_._M_dataplus._M_p =
                   (_Alloc_hider)(_Alloc_hider)local_2b0._M_dataplus._M_p;
            }
            result.field_0._17_7_ = local_2b0.field_2._M_allocated_capacity._1_7_;
            result.field_0._16_1_ = local_2b0.field_2._M_local_buf[0];
            result.field_0.error_.error_._M_string_length = local_2b0._M_string_length;
            local_2b0._M_string_length = 0;
            local_2b0.field_2._M_local_buf[0] = '\0';
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(&tex_type_result,(UnexpectedType *)__return_storage_ptr___00);
            std::__cxx11::string::~string((string *)__return_storage_ptr___00);
            std::__cxx11::string::~string((string *)&local_2b0);
          }
          else {
            prVar19 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::value((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&texture);
            pbVar22 = prVar19->_M_data;
            bVar14 = std::operator==(pbVar22,"RGBA8");
            if (bVar14) {
              tex_type_result.field_0.error_.error_._M_dataplus._M_p =
                   (_Alloc_hider)
                   ((ulong)tex_type_result.field_0.error_.error_._M_dataplus._M_p &
                   0xffffffff00000000);
            }
            else {
              bVar14 = std::operator==(pbVar22,"RGBA16F");
              if (bVar14) {
                tex_type_result.field_0.value_ = 1;
              }
              else {
                bVar14 = std::operator==(pbVar22,"RGBA32F");
                if (!bVar14) {
                  format_abi_cxx11_(&local_2b0,"Unexpected pixel type %s",
                                    (pbVar22->_M_dataplus)._M_p);
                  goto LAB_00120734;
                }
                tex_type_result.field_0.value_ = 2;
              }
            }
            tex_type_result.has_value_ = true;
          }
          Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected((Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&texture);
          iVar26 = fb.textures_count;
          if (tex_type_result.has_value_ == false) {
            uVar9 = *(undefined8 *)__rhs;
            pbVar22 = Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::error(&tex_type_result);
            format_abi_cxx11_((string *)__return_storage_ptr___00,
                              "Framebuffer %s texture %d has invalid pixel type: %s",uVar9,
                              (ulong)(uint)iVar26,(pbVar22->_M_dataplus)._M_p);
            texture._0_8_ = &texture.file;
            _Var1._M_p = (pointer)((long)&result.field_0 + 0x10);
            if (result.field_0.error_.error_._M_dataplus._M_p == (_Alloc_hider)_Var1._M_p) {
              texture.file._M_string_length = result.field_0._24_8_;
            }
            else {
              texture._0_8_ = result.field_0.error_.error_._M_dataplus._M_p;
            }
            texture.file._M_dataplus._M_p = (pointer)result.field_0._16_8_;
            texture._8_8_ = result.field_0.error_.error_._M_string_length;
            result.field_0.error_.error_._M_string_length = 0;
            result.field_0._16_8_ = result.field_0._16_8_ & 0xffffffffffffff00;
            result.field_0.error_.error_._M_dataplus._M_p = (_Alloc_hider)_Var1._M_p;
            Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,(UnexpectedType *)&texture);
            std::__cxx11::string::~string((string *)&texture);
LAB_00120f9b:
            std::__cxx11::string::~string((string *)__return_storage_ptr___00);
            Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected(&tex_type_result);
            Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected(&tex_result);
            goto LAB_00120fbe;
          }
          pPVar20 = Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value(&tex_type_result);
          lVar27 = (long)(this->names_).texture.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->names_).texture.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          if (lVar27 != ((long)(this->pipeline_->textures).
                               super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->pipeline_->textures).
                              super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x30) {
            __assert_fail("tex_index == pipeline_.textures.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/RenderDesc.cpp"
                          ,0xca,"Expected<void, std::string> renderdesc::Loader::loadFramebuffers()"
                         );
          }
          texture.h = (int)lVar13;
          texture.w = (int)lVar12;
          texture.pixel_type = *pPVar20;
          texture.file._M_dataplus._M_p = (pointer)&texture.file.field_2;
          texture.file._M_string_length = 0;
          p_Var25 = p_Var25 + 1;
          texture.file.field_2._M_local_buf[0] = '\0';
          iVar26 = (int)lVar27;
          if (bVar28) {
            std::operator+(&local_108,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs,"@ping.");
            std::operator+(&local_2b0,&local_108,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var25);
            Texture::Texture((Texture *)local_60,&texture);
            registerTexture((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)__return_storage_ptr___00,this,iVar26,Ping,&local_2b0,
                            (Texture *)local_60);
            std::__cxx11::string::~string((string *)(local_60 + 0x10));
            std::__cxx11::string::~string((string *)&local_2b0);
            std::__cxx11::string::~string((string *)&local_108);
            if (result.has_value_ == false) {
              pbVar22 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::error(&result);
              std::__cxx11::string::string((string *)&local_2b0,(string *)pbVar22);
              Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_2b0);
              std::__cxx11::string::~string((string *)&local_2b0);
            }
            else {
              Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Expected(&result);
              std::operator+(&local_108,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs,"@pong.");
              std::operator+(&local_2b0,&local_108,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var25);
              Texture::Texture((Texture *)local_90,&texture);
              registerTexture(&result,this,iVar26,Pong,&local_2b0,(Texture *)local_90);
              std::__cxx11::string::~string((string *)(local_90 + 0x10));
              std::__cxx11::string::~string((string *)&local_2b0);
              std::__cxx11::string::~string((string *)&local_108);
              if (result.has_value_ != false) goto LAB_00120a3d;
              pbVar22 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::error(&result);
              std::__cxx11::string::string((string *)&local_2b0,(string *)pbVar22);
LAB_00120ed0:
              Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_2b0);
              std::__cxx11::string::~string((string *)&local_2b0);
            }
            Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected(&result);
            __return_storage_ptr___00 =
                 (Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&texture.file;
            goto LAB_00120f9b;
          }
          std::operator+(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs,
                         ".");
          std::operator+(&local_2b0,&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         p_Var25);
          Texture::Texture((Texture *)local_c0,&texture);
          registerTexture((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)__return_storage_ptr___00,this,iVar26,Fixed,&local_2b0,
                          (Texture *)local_c0);
          std::__cxx11::string::~string((string *)(local_c0 + 0x10));
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&local_108);
          if (result.has_value_ == false) {
            pbVar22 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::error((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)__return_storage_ptr___00);
            std::__cxx11::string::string((string *)&local_2b0,(string *)pbVar22);
            goto LAB_00120ed0;
          }
LAB_00120a3d:
          Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected(&result);
          fb.textures[fb.textures_count] = iVar26;
          fb.textures_count = fb.textures_count + 1;
          std::__cxx11::string::~string((string *)&texture.file);
          Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected(&tex_type_result);
          Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected(&tex_result);
          this_06 = this_06 + 1;
        }
        pPVar8 = this->pipeline_;
        uVar21 = ((long)(pPVar8->framebuffers).
                        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pPVar8->framebuffers).
                       super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x14;
        if (bVar28) {
          std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::push_back
                    (&pPVar8->framebuffers,&fb);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &texture,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__rhs,"@ping");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texture);
          std::__cxx11::string::~string((string *)&texture);
          texture.h = 1;
          texture.w = (int)uVar21;
          std::vector<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>::
          emplace_back<renderdesc::Command::Index>(&this_01->framebuffer,(Index *)&texture);
          uVar21 = (ulong)(uint)fb.textures_count;
          if (fb.textures_count < 1) {
            uVar21 = 0;
          }
          for (uVar24 = 0; uVar21 != uVar24; uVar24 = uVar24 + 1) {
            fb.textures[uVar24] = fb.textures[uVar24] + 1;
          }
          pPVar8 = this->pipeline_;
          pFVar10 = (pPVar8->framebuffers).
                    super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pFVar11 = (pPVar8->framebuffers).
                    super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::push_back
                    (&pPVar8->framebuffers,&fb);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &texture,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__rhs,"@pong");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&texture);
          std::__cxx11::string::~string((string *)&texture);
          texture._0_8_ = ((long)pFVar10 - (long)pFVar11) / 0x14 & 0xffffffff;
          std::vector<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>::
          emplace_back<renderdesc::Command::Index>(&this_01->framebuffer,(Index *)&texture);
        }
        else {
          std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::push_back
                    (&pPVar8->framebuffers,&fb);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this_00->framebuffer,(value_type *)__rhs);
          texture._0_8_ = uVar21 & 0xffffffff;
          std::vector<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>::
          emplace_back<renderdesc::Command::Index>(&this_01->framebuffer,(Index *)&texture);
        }
      }
LAB_00120fbe:
      Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected(&textures_result);
      Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected(&pingpong_result);
      Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected(&height_result);
      Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected(&width_result);
      Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected(&size_result);
      Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected(&yfb_result);
      if (!bVar29) goto LAB_00121585;
    }
    __return_storage_ptr__->has_value_ = true;
  }
LAB_00121585:
  Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected(&map_fb_result);
  return __return_storage_ptr__;
}

Assistant:

Expected<void, std::string> loadFramebuffers() {
		auto map_fb_result = root_.getMapping("framebuffers");
		if (!map_fb_result)
			return Unexpected(map_fb_result.error());

		for (const auto &[name, yfbv]: map_fb_result.value().get().map()) {
			if (std::find(names_.framebuffer.begin(), names_.framebuffer.end(), name) != names_.framebuffer.end())
				return Unexpected(format("Framebuffer '%s' is not unique", name.c_str()));

			auto yfb_result = yfbv.getMapping();
			if (!yfb_result)
				return Unexpected("Framebuffer " + name + " desc object is not a mapping");
			const yaml::Mapping &yfb = yfb_result.value();

			const size_t framebuffer_index = names_.framebuffer.size();
			assert(framebuffer_index == pipeline_.framebuffers.size());

			auto size_result = yfb.getSequence("size");
			if (!size_result)
				return Unexpected("Cannot read size for framebuffer " + name + ": " + size_result.error());
			const yaml::Sequence &size = size_result.value();

			if (size.size() != 2)
				return Unexpected("Framebuffer " + name + " size must have 2 elements");

			auto width_result = readVariable(size[0]);
			if (!width_result)
				return Unexpected("Cannot read width for framebuffer " + name + ": " + width_result.error());
			const int width = width_result.value();

			auto height_result = readVariable(size[1]);
			if (!height_result)
				return Unexpected("Cannot read height for framebuffer " + name + ": " + height_result.error());
			const int height = height_result.value();

			const auto pingpong_result = yfb.getInt("pingpong");
			const bool pingpong = pingpong_result && pingpong_result.value();

			auto textures_result = yfb.getSequence("textures");
			if (!textures_result)
				return Unexpected("Cannot read target textures for framebuffer " + name + ": " + textures_result.error());
			const yaml::Sequence &ytextures = textures_result.value();
			Framebuffer fb;
			fb.textures_count = 0;
			for (const auto &ytex: ytextures) {
				auto tex_result = ytex.getMapping();
				if (!tex_result)
					return Unexpected(format("%dth texture of framebuffer %s is not a mapping", fb.textures_count, name.c_str()));
				const yaml::Mapping &tex = tex_result.value();
				if (tex.map().size() != 1)
					return Unexpected("Framebuffer " + name + " target texture should have only one key:value pair: name and format");

				const auto &[tex_name, tex_type_name] = *tex.map().begin();
				if (fb.textures_count >= MAX_TARGET_TEXTURES)
					return Unexpected(format("Too many targets for framebuffer %s, max: %d",
						name.c_str(), MAX_TARGET_TEXTURES));

				auto tex_type_result = pixelTypeFromValue(tex_type_name);
				if (!tex_type_result)
					return Unexpected(format("Framebuffer %s texture %d has invalid pixel type: %s",
						name.c_str(), fb.textures_count, tex_type_result.error().c_str()));
				const PixelType tex_type = tex_type_result.value();

				const size_t tex_index = names_.texture.size();
				assert(tex_index == pipeline_.textures.size());

				Texture texture{width, height, tex_type};
				if (pingpong) {
					{
						auto result = registerTexture(tex_index, Command::Index::Pingpong::Ping, name + "@ping." + tex_name, texture);
						if (!result)
							return Unexpected(result.error());
					}

					{
						auto result = registerTexture(tex_index, Command::Index::Pingpong::Pong, name + "@pong." + tex_name, texture);
						if (!result)
							return Unexpected(result.error());
					}
				} else {
					auto result = registerTexture(tex_index, Command::Index::Pingpong::Fixed, name + "." + tex_name, texture);
					if (!result)
						return Unexpected(result.error());
				}

				fb.textures[fb.textures_count] = (int)tex_index;
				++fb.textures_count;
			}

			if (pingpong) {
				{
					const int index = (int)pipeline_.framebuffers.size();
					pipeline_.framebuffers.push_back(fb);
					names_.framebuffer.push_back(name + "@ping");
					indexes_.framebuffer.emplace_back(Command::Index(index, Command::Index::Pingpong::Ping));
				}

				for (int i = 0; i < fb.textures_count; ++i)
					fb.textures[i] += 1;

				{
					const int index = (int)pipeline_.framebuffers.size();
					pipeline_.framebuffers.push_back(fb);
					names_.framebuffer.push_back(name + "@pong");
					indexes_.framebuffer.emplace_back(Command::Index(index));
				}
			} else {
				const int index = (int)pipeline_.framebuffers.size();
				pipeline_.framebuffers.push_back(fb);
				names_.framebuffer.push_back(name);
				indexes_.framebuffer.emplace_back(Command::Index(index));
			}
		}

		return Expected<void, std::string>();
	}